

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

PrimInfoMB *
embree::sse2::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,mvector<SubGridBuildData> *sgrids,
          BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  undefined8 uVar1;
  undefined8 this;
  char cVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  task *ptVar6;
  runtime_error *prVar7;
  ulong uVar8;
  PrimInfoMB *pPVar9;
  ulong uVar10;
  size_t i;
  size_t sVar11;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_00;
  size_t i_1;
  size_t sVar12;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_01;
  ulong uVar13;
  ulong uVar14;
  size_t N;
  ulong uVar15;
  size_t i_3;
  ulong uVar16;
  undefined1 local_4f12;
  auto_partitioner local_4f11;
  size_t taskCount;
  undefined8 local_4f08;
  BBox1f t0t1_local;
  undefined8 local_4ef8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4ef0;
  undefined1 local_4ee0 [16];
  undefined1 local_4ed0 [16];
  undefined1 local_4ec0 [16];
  mvector<SubGridBuildData> *local_4eb0;
  BBox1f *local_4ea8;
  Iterator2 iter;
  task_group_context context;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4df8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4de8;
  float *local_4de0;
  undefined1 *local_4dd8;
  float *local_4dd0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d58;
  undefined8 local_4d48;
  undefined8 uStack_4d40;
  undefined8 local_4d38;
  undefined8 uStack_4d30;
  undefined8 local_4d28;
  undefined8 uStack_4d20;
  undefined8 local_4d18;
  undefined8 uStack_4d10;
  undefined8 local_4d08;
  undefined8 uStack_4d00;
  undefined8 local_4cf8;
  undefined8 uStack_4cf0;
  undefined4 local_4ce8;
  undefined8 local_4ce4;
  undefined4 local_4cdc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4cd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4cc8;
  undefined8 local_4cb8;
  undefined8 uStack_4cb0;
  undefined8 local_4ca8;
  undefined8 uStack_4ca0;
  undefined8 local_4c98;
  undefined8 uStack_4c90;
  undefined8 local_4c88;
  undefined8 uStack_4c80;
  undefined8 local_4c78;
  undefined8 uStack_4c70;
  undefined8 local_4c68;
  undefined8 uStack_4c60;
  undefined4 local_4c58;
  undefined8 local_4c54;
  undefined4 local_4c4c;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  
  pstate.super_ParallelForForState.taskCount = 0;
  iter.mblur = true;
  t0t1_local = t0t1;
  local_4ef0._8_8_ = prims;
  local_4ee0._0_8_ = sgrids;
  local_4ed0._0_8_ = numPrimRefs;
  iter.scene = scene;
  iter.typemask = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
  sVar12 = (scene->geometries).size_active;
  uVar15 = 0;
  context.my_cpu_ctl_env = (uint64_t)&iter;
  for (sVar11 = 0; sVar12 != sVar11; sVar11 = sVar11 + 1) {
    sVar4 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::operator()
                      ((anon_class_8_1_4d25ca37 *)&context,sVar11);
    uVar15 = uVar15 + sVar4;
  }
  local_4f08 = __return_storage_ptr__;
  pstate.super_ParallelForForState.N = uVar15;
  iVar3 = tbb::detail::d1::max_concurrency();
  uVar8 = uVar15 + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar8) {
    uVar8 = (long)iVar3;
  }
  uVar5 = 0x40;
  if (uVar8 < 0x40) {
    uVar5 = uVar8;
  }
  sVar12 = 0;
  pstate.super_ParallelForForState.taskCount = uVar5 + (uVar5 == 0);
  pstate.super_ParallelForForState.i0[0] = 0;
  pstate.super_ParallelForForState.j0[0] = 0;
  uVar5 = uVar15 / pstate.super_ParallelForForState.taskCount;
  uVar8 = 1;
  uVar16 = 0;
  while (sVar11 = pstate.super_ParallelForForState.taskCount,
        uVar8 < pstate.super_ParallelForForState.taskCount) {
    sVar11 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::
             operator()((anon_class_8_1_4d25ca37 *)&context,sVar12);
    uVar13 = (uVar8 + 1) * uVar15;
    uVar14 = 0;
    uVar10 = uVar16;
    for (; ((uVar16 = (uVar10 + sVar11) - uVar14, uVar14 < sVar11 && (uVar5 <= uVar16)) &&
           (uVar8 < pstate.super_ParallelForForState.taskCount)); uVar8 = uVar8 + 1) {
      pstate.super_ParallelForForState.i0[uVar8] = sVar12;
      uVar14 = uVar14 + (uVar5 - uVar10);
      pstate.super_ParallelForForState.j0[uVar8] = uVar14;
      uVar16 = uVar13 / pstate.super_ParallelForForState.taskCount;
      uVar13 = uVar13 + uVar15;
      uVar10 = uVar5;
      uVar5 = uVar16;
    }
    sVar12 = sVar12 + 1;
  }
  local_4de8 = &local_4d68;
  local_4d68._0_8_ = 0x7f8000007f800000;
  local_4d68._8_8_ = 0x7f8000007f800000;
  local_4d58._0_8_ = 0xff800000ff800000;
  local_4d58._8_8_ = 0xff800000ff800000;
  local_4d48 = 0x7f8000007f800000;
  uStack_4d40 = 0x7f8000007f800000;
  local_4d38 = 0xff800000ff800000;
  uStack_4d30 = 0xff800000ff800000;
  local_4d28 = 0x7f8000007f800000;
  uStack_4d20 = 0x7f8000007f800000;
  local_4d18 = 0xff800000ff800000;
  uStack_4d10 = 0xff800000ff800000;
  local_4ce8 = 0;
  local_4d08 = 0;
  uStack_4d00 = 0;
  local_4cf8 = 0;
  uStack_4cf0 = 0;
  local_4ce4 = 0x3f8000003f800000;
  local_4cdc = 0;
  local_4ed0._8_8_ = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ec0)->m128 + 2;
  local_4ec0._8_8_ = local_4ef0._8_8_;
  local_4eb0 = (mvector<SubGridBuildData> *)local_4ee0._0_8_;
  local_4ea8 = &t0t1_local;
  local_4de0 = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ee0)->m128 + 2;
  local_4ee0._8_8_ = &iter;
  local_4dd0 = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ed0)->m128 + 2;
  pPVar9 = (PrimInfoMB *)&taskCount;
  local_4df8._0_8_ = &pstate;
  local_4dd8 = &local_4f12;
  taskCount = pstate.super_ParallelForForState.taskCount;
  local_4ec0._0_8_ = local_4ee0._8_8_;
  local_4df8._8_8_ = pPVar9;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  uVar1 = local_4f08;
  local_4ef8 = &local_4df8;
  if (sVar11 != 0) {
    local_4ef0._0_8_ = 0;
    ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4ef0,0xc0);
    ptVar6->m_reserved[3] = 0;
    ptVar6->m_reserved[4] = 0;
    ptVar6->m_reserved[5] = 0;
    ptVar6->m_reserved[1] = 0;
    ptVar6->m_reserved[2] = 0;
    (ptVar6->super_task_traits).m_version_and_traits = 0;
    ptVar6->m_reserved[0] = 0;
    ptVar6->_vptr_task = (_func_int **)&PTR__task_021d98b0;
    ptVar6[1]._vptr_task = (_func_int **)sVar11;
    ptVar6[1].super_task_traits.m_version_and_traits = 0;
    ptVar6[1].m_reserved[0] = 1;
    ptVar6[1].m_reserved[1] = (uint64_t)&local_4ef8;
    ptVar6[1].m_reserved[2] = 0;
    ptVar6[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar6[1].m_reserved + 5),&local_4f11);
    ptVar6[2].super_task_traits.m_version_and_traits = local_4ef0._0_8_;
    local_4cd8._0_8_ = 0;
    local_4cd8.m128[2] = (float)1;
    local_4cc8._0_8_ = 1;
    local_4cc8._8_8_ = 1;
    ptVar6[1].m_reserved[4] = (uint64_t)&local_4cd8;
    pPVar9 = (PrimInfoMB *)&context;
    tbb::detail::r1::execute_and_wait
              (ptVar6,(task_group_context *)pPVar9,(wait_context *)&local_4cc8.field_1,
               (task_group_context *)pPVar9);
  }
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar2 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)uVar1,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
    uVar1 = local_4f08;
    this_00 = pstate.prefix_state.sums;
    this_01 = this_00;
    for (uVar15 = 0; this = local_4f08, uVar15 < taskCount; uVar15 = uVar15 + 1) {
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this_01 + -0x40);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                (this_01,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)uVar1);
      createPrimRefArrayMSMBlur::anon_class_1_0_00000001::operator()
                ((PrimInfoMB *)&local_4df8.field_1,(anon_class_1_0_00000001 *)uVar1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,pPVar9);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)uVar1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4df8.field_1);
      this_01 = this_01 + 1;
    }
    if (*(unsigned_long *)(local_4f08 + 0x68) -
        ((range<unsigned_long> *)(local_4f08 + 0x60))->_begin != local_4ed0._0_8_) {
      (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
      sVar12 = pstate.super_ParallelForForState.taskCount;
      local_4de8 = &local_4cd8;
      local_4cd8._0_8_ = 0x7f8000007f800000;
      local_4cd8._8_8_ = 0x7f8000007f800000;
      local_4cc8._0_8_ = 0xff800000ff800000;
      local_4cc8._8_8_ = 0xff800000ff800000;
      local_4cb8 = 0x7f8000007f800000;
      uStack_4cb0 = 0x7f8000007f800000;
      local_4ca8 = 0xff800000ff800000;
      uStack_4ca0 = 0xff800000ff800000;
      local_4c98 = 0x7f8000007f800000;
      uStack_4c90 = 0x7f8000007f800000;
      local_4c88 = 0xff800000ff800000;
      uStack_4c80 = 0xff800000ff800000;
      local_4c78 = 0;
      uStack_4c70 = 0;
      local_4c68 = 0;
      uStack_4c60 = 0;
      local_4c58 = 0;
      local_4c54 = 0x3f8000003f800000;
      local_4c4c = 0;
      local_4ec0._8_8_ = local_4ef0._8_8_;
      local_4eb0 = (mvector<SubGridBuildData> *)local_4ee0._0_8_;
      local_4ea8 = &t0t1_local;
      local_4ee0._8_8_ = &iter;
      local_4ed0._8_8_ = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ec0)->m128 + 2;
      taskCount = pstate.super_ParallelForForState.taskCount;
      local_4df8._0_8_ = &pstate;
      pPVar9 = (PrimInfoMB *)&taskCount;
      local_4de0 = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ee0)->m128 + 2;
      local_4dd8 = &local_4f12;
      local_4dd0 = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4ed0)->m128 + 2;
      local_4ec0._0_8_ = local_4ee0._8_8_;
      local_4df8._8_8_ = pPVar9;
      tbb::detail::d1::task_group_context::task_group_context
                (&context,(context_traits)0x4,CUSTOM_CTX);
      local_4ef8 = &local_4df8;
      if (sVar12 != 0) {
        local_4ef0._0_8_ = 0;
        ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4ef0,0xc0);
        ptVar6->m_reserved[3] = 0;
        ptVar6->m_reserved[4] = 0;
        ptVar6->m_reserved[5] = 0;
        ptVar6->m_reserved[1] = 0;
        ptVar6->m_reserved[2] = 0;
        (ptVar6->super_task_traits).m_version_and_traits = 0;
        ptVar6->m_reserved[0] = 0;
        ptVar6->_vptr_task = (_func_int **)&PTR__task_021d98f8;
        ptVar6[1]._vptr_task = (_func_int **)sVar12;
        ptVar6[1].super_task_traits.m_version_and_traits = 0;
        ptVar6[1].m_reserved[0] = 1;
        ptVar6[1].m_reserved[1] = (uint64_t)&local_4ef8;
        ptVar6[1].m_reserved[2] = 0;
        ptVar6[1].m_reserved[3] = 1;
        tbb::detail::d1::auto_partition_type::auto_partition_type
                  ((auto_partition_type *)(ptVar6[1].m_reserved + 5),&local_4f11);
        ptVar6[2].super_task_traits.m_version_and_traits = local_4ef0._0_8_;
        local_4d68._0_8_ = 0;
        local_4d68.m128[2] = (float)1;
        local_4d58._0_8_ = 1;
        local_4d58._8_8_ = 1;
        ptVar6[1].m_reserved[4] = (uint64_t)&local_4d68;
        pPVar9 = (PrimInfoMB *)&context;
        tbb::detail::r1::execute_and_wait
                  (ptVar6,(task_group_context *)pPVar9,(wait_context *)&local_4d58.field_1,
                   (task_group_context *)pPVar9);
      }
      cVar2 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar2 != '\0') {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"task cancelled");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4cd8.field_1);
      for (uVar15 = 0; uVar15 < taskCount; uVar15 = uVar15 + 1) {
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this_00 + -0x40);
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                  (this_00,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
        createPrimRefArrayMSMBlur::anon_class_1_0_00000001::operator()
                  ((PrimInfoMB *)&local_4df8.field_1,(anon_class_1_0_00000001 *)&local_4d68.field_1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,pPVar9);
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4df8.field_1);
        this_00 = this_00 + 1;
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)this,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
    }
    *(BBox1f *)(this + 0x88) = t0t1_local;
    return (PrimInfoMB *)this;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"task cancelled");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
         return mesh->createPrimRefMBArray(prims,sgrids,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,sgrids,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }